

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_udp_bind(uv_udp_t *handle,sockaddr *addr,uint flags)

{
  short *in_RSI;
  sockaddr *in_RDI;
  uint addrlen;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(int *)(in_RDI[1].sa_data + 6) == 0xf) {
    if ((*in_RSI == 2) || (*in_RSI == 10)) {
      iVar1 = uv__udp_bind((uv_udp_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,in_RDI,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI);
    }
    else {
      iVar1 = -0x16;
    }
  }
  else {
    iVar1 = -0x16;
  }
  return iVar1;
}

Assistant:

int uv_udp_bind(uv_udp_t* handle,
                const struct sockaddr* addr,
                unsigned int flags) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__udp_bind(handle, addr, addrlen, flags);
}